

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_solve_ab(REF_INT rows,REF_INT cols,REF_DBL *ab)

{
  ulong uVar1;
  undefined8 uVar2;
  double dVar3;
  bool bVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  REF_DBL *pRVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  REF_DBL *pRVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  double *pdVar23;
  REF_DBL RVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  long local_58;
  double *local_50;
  long local_48;
  
  if (rows < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = (long)cols;
    uVar5 = (ulong)(uint)rows;
    uVar22 = (ulong)(uint)cols;
    lVar15 = uVar5 * 8 + 8;
    uVar10 = 1;
    local_48 = 0;
    local_58 = 8;
    lVar17 = 0;
    uVar19 = 0;
    bVar6 = 0;
    uVar12 = 0;
    local_50 = ab;
    do {
      lVar13 = (long)((int)uVar12 * rows);
      uVar1 = uVar12 + 1;
      uVar14 = uVar12 & 0xffffffff;
      if (uVar1 < uVar5) {
        dVar25 = ab[uVar12 + lVar13];
        if (dVar25 <= -dVar25) {
          dVar25 = -dVar25;
        }
        uVar14 = uVar12 & 0xffffffff;
        uVar21 = uVar10;
        do {
          dVar26 = ab[uVar19 + uVar21];
          if (dVar26 <= -dVar26) {
            dVar26 = -dVar26;
          }
          if (dVar25 < dVar26) {
            uVar14 = uVar21 & 0xffffffff;
            dVar25 = dVar26;
          }
          uVar21 = uVar21 + 1;
        } while (uVar5 != uVar21);
      }
      if ((long)uVar12 < lVar8 && uVar12 != uVar14) {
        lVar16 = local_48 + (long)(int)uVar14 * 8;
        uVar14 = uVar22;
        pRVar9 = ab;
        do {
          uVar2 = *(undefined8 *)((long)pRVar9 + lVar16);
          *(undefined8 *)((long)pRVar9 + lVar16) = *(undefined8 *)((long)pRVar9 + lVar17);
          *(undefined8 *)((long)pRVar9 + lVar17) = uVar2;
          pRVar9 = pRVar9 + uVar5;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      if ((long)uVar12 < lVar8) {
        dVar25 = ab[uVar12 + lVar13];
        dVar26 = dVar25 * 1e+20;
        if (dVar26 <= -dVar26) {
          dVar26 = -dVar26;
        }
        uVar14 = uVar22;
        pdVar23 = local_50;
        dVar27 = dVar25;
        if (dVar25 <= -dVar25) {
          dVar27 = -dVar25;
        }
        do {
          dVar3 = *pdVar23;
          dVar28 = dVar3;
          if (dVar3 <= -dVar3) {
            dVar28 = -dVar3;
          }
          if (dVar26 <= dVar28) {
            return 4;
          }
          if (dVar27 < 1e-13) {
            bVar6 = 1;
          }
          *pdVar23 = dVar3 / dVar25;
          uVar14 = uVar14 - 1;
          pdVar23 = pdVar23 + uVar5;
        } while (uVar14 != 0);
      }
      if (uVar1 < uVar5) {
        uVar14 = uVar10;
        lVar13 = local_58;
        do {
          if ((long)uVar12 < lVar8) {
            dVar25 = ab[(uint)((int)uVar12 * rows) + uVar14];
            pRVar9 = ab;
            uVar21 = uVar22;
            do {
              *(double *)((long)pRVar9 + lVar13) =
                   *(double *)((long)pRVar9 + lVar13) - *(double *)((long)pRVar9 + lVar17) * dVar25;
              pRVar9 = pRVar9 + uVar5;
              uVar21 = uVar21 - 1;
            } while (uVar21 != 0);
          }
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 8;
        } while (uVar14 != uVar5);
      }
      uVar10 = uVar10 + 1;
      uVar19 = (ulong)(uint)((int)uVar19 + rows);
      lVar17 = lVar17 + lVar15;
      local_48 = local_48 + uVar5 * 8;
      uVar22 = uVar22 - 1;
      local_50 = local_50 + uVar5 + 1;
      local_58 = local_58 + lVar15;
      uVar12 = uVar1;
    } while (uVar1 != uVar5);
    iVar7 = (uint)bVar6 << 3;
  }
  if (rows < cols) {
    lVar17 = (long)rows;
    lVar8 = (lVar17 * 8 + 8) * lVar17;
    pRVar9 = (REF_DBL *)((long)ab + lVar8);
    lVar15 = lVar17;
    do {
      if (0 < rows) {
        iVar20 = 0;
        pRVar18 = pRVar9;
        lVar13 = lVar17;
        pdVar23 = (double *)((long)ab + lVar8 + -8);
        do {
          RVar24 = ab[lVar15 * lVar17 + lVar13 + -1];
          if (lVar13 < lVar17) {
            lVar16 = 0;
            pdVar11 = pdVar23;
            do {
              RVar24 = RVar24 - *pdVar11 * pRVar18[lVar16];
              lVar16 = lVar16 + 1;
              pdVar11 = pdVar11 + lVar17;
            } while (iVar20 != (int)lVar16);
          }
          lVar16 = lVar13 + -1;
          dVar25 = ab[(rows + 1) * (int)lVar16] * 1e+20;
          if (dVar25 <= -dVar25) {
            dVar25 = -dVar25;
          }
          dVar26 = RVar24;
          if (RVar24 <= -RVar24) {
            dVar26 = -RVar24;
          }
          if (dVar25 <= dVar26) {
            return 4;
          }
          ab[lVar15 * lVar17 + lVar16] = RVar24 / ab[(rows + 1) * (int)lVar16];
          pRVar18 = pRVar18 + -1;
          pdVar23 = (double *)((long)pdVar23 + (lVar17 * 8 ^ 0xfffffffffffffff8U));
          iVar20 = iVar20 + 1;
          bVar4 = 1 < lVar13;
          lVar13 = lVar16;
        } while (bVar4);
      }
      lVar15 = lVar15 + 1;
      pRVar9 = pRVar9 + lVar17;
    } while ((int)lVar15 != cols);
  }
  return iVar7;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_solve_ab(REF_INT rows, REF_INT cols,
                                       REF_DBL *ab) {
  REF_INT row, col;
  REF_INT i, j, k;
  REF_INT pivot_row;
  REF_DBL largest_pivot, pivot;
  REF_DBL temp;
  REF_DBL factor;
  REF_DBL rhs;
  REF_BOOL ill_condition = REF_FALSE;

  for (col = 0; col < rows; col++) {
    /* find largest pivot */
    pivot_row = col;
    largest_pivot = ABS(ab[pivot_row + rows * col]);
    for (i = col + 1; i < rows; i++) {
      pivot = ABS(ab[i + rows * col]);
      if (pivot > largest_pivot) {
        largest_pivot = pivot;
        pivot_row = i;
      }
    }

    /* exchange rows to get the best pivot on the diagonal,
       unless it is already there */
    if (pivot_row != col)
      for (j = col; j < cols; j++) {
        temp = ab[pivot_row + j * rows];
        ab[pivot_row + j * rows] = ab[col + j * rows];
        ab[col + j * rows] = temp;
      }

    /* normalize pivot row */
    pivot = ab[col + rows * col];
    for (j = col; j < cols; j++) {
      if (!ref_math_divisible(ab[col + j * rows], pivot)) {
        return REF_DIV_ZERO;
      }
      if (ABS(pivot) < 1.0e-13) {
        ill_condition = REF_TRUE;
      }
      ab[col + j * rows] /= pivot;
    }

    /* eliminate sub diagonal terms */
    for (i = col + 1; i < rows; i++) {
      factor = ab[i + col * rows];
      for (j = col; j < cols; j++)
        ab[i + j * rows] -= ab[col + j * rows] * factor;
    }
  }

  for (col = rows; col < cols; col++)
    for (row = rows - 1; row > -1; row--) {
      rhs = ab[row + col * rows];
      for (k = row + 1; k < rows; k++)
        rhs -= ab[row + k * rows] * ab[k + col * rows];
      if (!ref_math_divisible(rhs, ab[row + row * rows])) return REF_DIV_ZERO;
      ab[row + col * rows] = rhs / ab[row + row * rows];
    }

  return (ill_condition ? REF_ILL_CONDITIONED : REF_SUCCESS);
}